

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O3

void __thiscall
CTxMemPool::GetTransactionAncestry
          (CTxMemPool *this,uint256 *txid,size_t *ancestors,size_t *descendants,size_t *ancestorsize
          ,CAmount *ancestorfees)

{
  iterator entry;
  uint64_t uVar1;
  CTxMemPool *this_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  unique_lock<std::recursive_mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_device = &(this->cs).super_recursive_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_48);
  this_00 = (CTxMemPool *)&(this->mapTx).super_type;
  entry = boost::multi_index::detail::
          hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
          ::find<uint256,SaltedTxidHasher,std::equal_to<uint256>>
                    ((hashed_index<mempoolentry_txid,SaltedTxidHasher,std::equal_to<uint256>,boost::multi_index::detail::nth_layer<1,CTxMemPoolEntry,CTxMemPool::CTxMemPoolEntry_Indices,std::allocator<CTxMemPoolEntry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
                      *)this_00,txid,&(this->mapTx).super_type.hash_);
  *descendants = 0;
  *ancestors = 0;
  if (entry.node !=
      (this->mapTx).
      super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
      .member) {
    *ancestors = *(size_t *)
                  ((long)&((entry.node)->
                          super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                          ).
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                          .
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                          .
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                          .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                          super_pod_value_holder<CTxMemPoolEntry>.space + 0xe0);
    if (ancestorsize != (size_t *)0x0) {
      *ancestorsize =
           *(size_t *)
            ((long)&((entry.node)->
                    super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                    ).
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                    .
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                    .
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                    .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                    super_pod_value_holder<CTxMemPoolEntry>.space + 0xe8);
    }
    if (ancestorfees != (CAmount *)0x0) {
      *ancestorfees =
           *(CAmount *)
            ((long)&((entry.node)->
                    super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                    ).
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                    .
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                    .
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                    .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                    super_pod_value_holder<CTxMemPoolEntry>.space + 0xf0);
    }
    uVar1 = CalculateDescendantMaximum(this_00,(txiter)entry.node);
    *descendants = uVar1;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTxMemPool::GetTransactionAncestry(const uint256& txid, size_t& ancestors, size_t& descendants, size_t* const ancestorsize, CAmount* const ancestorfees) const {
    LOCK(cs);
    auto it = mapTx.find(txid);
    ancestors = descendants = 0;
    if (it != mapTx.end()) {
        ancestors = it->GetCountWithAncestors();
        if (ancestorsize) *ancestorsize = it->GetSizeWithAncestors();
        if (ancestorfees) *ancestorfees = it->GetModFeesWithAncestors();
        descendants = CalculateDescendantMaximum(it);
    }
}